

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::EntryPointInfo::InstallGuards(EntryPointInfo *this,ScriptContext *scriptContext)

{
  Type *pTVar1;
  WriteBarrierPtr<Js::FakePropertyGuardWeakReference> *other;
  PropertyId propertyId_00;
  int iVar2;
  uint sourceContextId;
  uint uVar3;
  JitTransferData *pJVar4;
  ThreadContext *this_00;
  TypeGuardTransferEntry this_01;
  Type ppCVar5;
  ulong uVar6;
  CtorCacheTransferEntryIDL this_02;
  CtorCacheGuardTransferEntry this_03;
  code *pcVar7;
  Type *pTVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  LocalFunctionId LVar12;
  NativeEntryPointData *this_04;
  NativeEntryPointData *pNVar13;
  Type piVar14;
  EquivalentTypeCache *pEVar15;
  long lVar16;
  FakePropertyGuardWeakReference *ptr;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined8 uVar17;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  PropertyRecord *pPVar18;
  uint j;
  int iVar19;
  EquivalentTypeCache *pEVar20;
  ulong uVar21;
  EquivalentTypeCache *pEVar22;
  long lVar23;
  PropertyGuard *pPVar24;
  ulong uVar25;
  Type pCVar26;
  PropertyId propertyId;
  Type pTVar27;
  bool bVar28;
  byte bVar29;
  PropertyGuard *local_488;
  WCHAR prefixValue [512];
  undefined4 *local_50;
  WriteBarrierPtr<Js::FakePropertyGuardWeakReference> local_40;
  PropertyGuard *sharedPropertyGuard;
  
  bVar29 = 0;
  this_04 = GetNativeEntryPointData(this);
  pNVar13 = GetNativeEntryPointData(this);
  pJVar4 = (pNVar13->jitTransferData).ptr;
  if ((pJVar4 == (JitTransferData *)0x0) || (pJVar4->isReady != true)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    local_50 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *local_50 = 1;
    bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x20de,
                                "(jitTransferData != nullptr && jitTransferData->GetIsReady())",
                                "jitTransferData != nullptr && jitTransferData->GetIsReady()");
    if (!bVar9) goto LAB_006d7ca1;
    *local_50 = 0;
  }
  else {
    local_50 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  for (lVar23 = 0; lVar23 < pJVar4->lazyBailoutPropertyCount; lVar23 = lVar23 + 1) {
    piVar14 = pJVar4->lazyBailoutProperties;
    if (piVar14 == (Type)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *local_50 = 1;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x20e2,"(jitTransferData->lazyBailoutProperties != nullptr)",
                                  "jitTransferData->lazyBailoutProperties != nullptr");
      if (!bVar9) goto LAB_006d7ca1;
      *local_50 = 0;
      piVar14 = pJVar4->lazyBailoutProperties;
    }
    propertyId_00 = piVar14[lVar23];
    local_40.ptr = (FakePropertyGuardWeakReference *)0x0;
    bVar9 = NativeEntryPointData::TryGetSharedPropertyGuard
                      (this_04,propertyId_00,(PropertyGuard **)&local_40);
    if (!bVar9) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *local_50 = 1;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x20e7,"(hasSharedPropertyGuard)","hasSharedPropertyGuard");
      if (bVar9) {
        *local_50 = 0;
LAB_006d7bc9:
        bVar9 = Phases::IsEnabled((Phases *)&DAT_01453738,LazyBailoutPhase);
        if (bVar9) {
          iVar11 = (*(this->super_ProxyEntryPointInfo).super_ExpirableObject.super_FinalizableObject
                     .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0xb])(this);
          uVar17 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar11) + 0x38))
                             ((long *)CONCAT44(extraout_var_01,iVar11));
          iVar11 = (*(this->super_ProxyEntryPointInfo).super_ExpirableObject.super_FinalizableObject
                     .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0xb])(this);
          uVar3 = *(uint *)**(undefined8 **)
                             (*(long *)(CONCAT44(extraout_var_02,iVar11) + 0x20) + 0x70);
          iVar11 = (*(this->super_ProxyEntryPointInfo).super_ExpirableObject.super_FinalizableObject
                     .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0xb])(this);
          LVar12 = FunctionProxy::GetLocalFunctionId
                             ((FunctionProxy *)CONCAT44(extraout_var_03,iVar11));
          iVar11 = (*(this->super_ProxyEntryPointInfo).super_ExpirableObject.super_FinalizableObject
                     .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0xb])(this);
          swprintf_s<512ul>((WCHAR (*) [512])&local_488,L"Function %s (#%d.%u, #%u)",uVar17,
                            (ulong)uVar3,(ulong)LVar12,
                            (ulong)*(uint *)(CONCAT44(extraout_var_04,iVar11) + 0x40));
          pPVar18 = ScriptContext::GetPropertyName(scriptContext,propertyId_00);
          Output::TraceWithPrefix
                    (LazyBailoutPhase,(char16 *)&local_488,
                     L"Lazy bailout - Invalidation due to property: %s \n",pPVar18 + 1);
        }
        (*(this->super_ProxyEntryPointInfo).super_ExpirableObject.super_FinalizableObject.
          super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0xd])(this,1);
        return;
      }
      goto LAB_006d7ca1;
    }
    if (((ulong)((local_40.ptr)->super_RecyclerWeakReference<Js::PropertyGuard>).
                super_RecyclerWeakReferenceBase.strongRef & 0xfffffffffffffffd) == 0)
    goto LAB_006d7bc9;
    ThreadContext::RegisterLazyBailout(scriptContext->threadContext,propertyId_00,this);
  }
  if (0 < pJVar4->equivalentTypeGuardCount) {
    if (pJVar4->equivalentTypeGuardOffsets != (Type)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *local_50 = 1;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x20f9,"(jitTransferData->equivalentTypeGuardOffsets == nullptr)"
                                  ,"jitTransferData->equivalentTypeGuardOffsets == nullptr");
      if (!bVar9) goto LAB_006d7ca1;
      *local_50 = 0;
    }
    pPVar24 = (PropertyGuard *)pJVar4->equivalentTypeGuards;
    if (pPVar24 == (PropertyGuard *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *local_50 = 1;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x20fa,"(jitTransferData->equivalentTypeGuards != nullptr)",
                                  "jitTransferData->equivalentTypeGuards != nullptr");
      if (!bVar9) {
LAB_006d7ca1:
        pcVar7 = (code *)invalidInstructionException();
        (*pcVar7)();
      }
      *local_50 = 0;
      pPVar24 = (PropertyGuard *)pJVar4->equivalentTypeGuards;
    }
    iVar11 = pJVar4->equivalentTypeGuardCount;
    pEVar15 = NativeEntryPointData::EnsureEquivalentTypeCache(this_04,iVar11,scriptContext,this);
    pTVar8 = &pPVar24->value;
    while (pPVar24 < (PropertyGuard *)(pTVar8 + iVar11)) {
      pEVar20 = ((JitEquivalentTypeGuard *)pPVar24->value)->cache;
      pEVar22 = pEVar15;
      for (lVar23 = 0x5e; lVar23 != 0; lVar23 = lVar23 + -1) {
        *(undefined1 *)pEVar22->types = *(undefined1 *)pEVar20->types;
        pEVar20 = (EquivalentTypeCache *)((long)pEVar20 + (ulong)bVar29 * -2 + 1);
        pEVar22 = (EquivalentTypeCache *)((long)pEVar22 + (ulong)bVar29 * -2 + 1);
      }
      ((JitEquivalentTypeGuard *)pPVar24->value)->cache = pEVar15;
      lVar23 = 8;
      pEVar20 = pEVar15;
      for (lVar16 = 0; sharedPropertyGuard = pPVar24, lVar16 != 8; lVar16 = lVar16 + 1) {
        if (pEVar15->types[lVar16] == (Type *)0x0) goto LAB_006d77e8;
        pTVar1 = &pEVar15->types[lVar16]->flags;
        *pTVar1 = *pTVar1 | TypeFlagMask_HasBeenCached;
        lVar23 = lVar23 + -1;
        pEVar20 = (EquivalentTypeCache *)(pEVar20->types + 1);
      }
LAB_006d77ee:
      pEVar15 = pEVar15 + 1;
      pPVar24 = (PropertyGuard *)&sharedPropertyGuard->isPoly;
    }
  }
  if (pJVar4->propertyGuardsByPropertyId != (Type)0x0) {
    iVar11 = pJVar4->propertyGuardCount;
    prefixValue._1016_8_ =
         NativeEntryPointData::EnsurePropertyGuardWeakRefs(this_04,iVar11,scriptContext->recycler);
    this_00 = scriptContext->threadContext;
    for (pTVar27 = pJVar4->propertyGuardsByPropertyId; iVar19 = pTVar27->propertyId, iVar19 != -1;
        pTVar27 = pTVar27 + (long)(int)pPVar24 + 1) {
      local_488 = (PropertyGuard *)0x0;
      bVar9 = NativeEntryPointData::TryGetSharedPropertyGuard(this_04,iVar19,&local_488);
      if (bVar9) {
        bVar28 = (local_488->value & 0xfffffffffffffffdU) != 0;
      }
      else {
        bVar28 = false;
      }
      pPVar24 = (PropertyGuard *)&DAT_00000001;
      while( true ) {
        this_01 = pTVar27[(long)((int)pPVar24 + -1) + 1];
        if (this_01 == (TypeGuardTransferEntry)0x0) break;
        if (bVar9) {
          iVar2 = *(int *)((long)this_01 + 0xc);
          sharedPropertyGuard = pPVar24;
          if (((long)iVar2 < 0) || (iVar11 <= iVar2)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *local_50 = 1;
            bVar10 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                         ,0x2187,
                                         "(guardIndex >= 0 && guardIndex < propertyGuardCount)",
                                         "guardIndex >= 0 && guardIndex < propertyGuardCount");
            if (!bVar10) goto LAB_006d7ca1;
            *local_50 = 0;
          }
          if (bVar28) {
            other = (WriteBarrierPtr<Js::FakePropertyGuardWeakReference> *)
                    (prefixValue._1016_8_ + (long)iVar2 * 8);
            Memory::WriteBarrierPtr<Js::FakePropertyGuardWeakReference>::WriteBarrierPtr
                      (&local_40,other);
            if (local_40.ptr == (FakePropertyGuardWeakReference *)0x0) {
              ptr = FakePropertyGuardWeakReference::New
                              (scriptContext->recycler,(PropertyGuard *)this_01);
              Memory::WriteBarrierPtr<Js::FakePropertyGuardWeakReference>::WriteBarrierSet
                        (&local_40,ptr);
              Memory::WriteBarrierPtr<Js::FakePropertyGuardWeakReference>::WriteBarrierSet
                        (other,local_40.ptr);
            }
            pPVar24 = sharedPropertyGuard;
            if ((TypeGuardTransferEntry)
                ((local_40.ptr)->super_RecyclerWeakReference<Js::PropertyGuard>).
                super_RecyclerWeakReferenceBase.strongRef != this_01) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *local_50 = 1;
              bVar10 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                           ,0x2192,"(propertyGuardWeakRef->Get() == guard)",
                                           "propertyGuardWeakRef->Get() == guard");
              if (!bVar10) goto LAB_006d7ca1;
              *local_50 = 0;
            }
            ThreadContext::RegisterUniquePropertyGuard
                      (this_00,iVar19,
                       &(local_40.ptr)->super_RecyclerWeakReference<Js::PropertyGuard>);
          }
          else {
            PropertyGuard::Invalidate((PropertyGuard *)this_01);
            pPVar24 = sharedPropertyGuard;
          }
        }
        pPVar24 = (PropertyGuard *)(ulong)((int)pPVar24 + 1);
      }
    }
  }
  ppCVar5 = (pJVar4->ctorCacheTransferData).entries;
  if (ppCVar5 != (Type)0x0) {
    sharedPropertyGuard = (PropertyGuard *)scriptContext->threadContext;
    for (uVar25 = 0; uVar25 < (pJVar4->ctorCacheTransferData).ctorCachesCount; uVar25 = uVar25 + 1)
    {
      uVar3 = ppCVar5[uVar25]->propId;
      local_488 = (PropertyGuard *)0x0;
      bVar9 = NativeEntryPointData::TryGetSharedPropertyGuard(this_04,uVar3,&local_488);
      if (bVar9) {
        uVar6 = local_488->value;
        for (uVar21 = 0; uVar21 < ppCVar5[uVar25]->cacheCount; uVar21 = uVar21 + 1) {
          this_02 = ppCVar5[uVar25][uVar21 + 1];
          if ((uVar6 & 0xfffffffffffffffd) == 0) {
            ConstructorCache::InvalidateAsGuard((ConstructorCache *)this_02);
          }
          else {
            ThreadContext::RegisterConstructorCache
                      ((ThreadContext *)sharedPropertyGuard,uVar3,(ConstructorCache *)this_02);
          }
        }
      }
    }
  }
  pCVar26 = pJVar4->ctorCacheGuardsByPropertyId;
  if (pCVar26 != (Type)0x0) {
    sharedPropertyGuard = (PropertyGuard *)scriptContext->threadContext;
    for (; iVar11 = pCVar26->propertyId, iVar11 != -1; pCVar26 = pCVar26 + (long)iVar19 + 1) {
      local_488 = (PropertyGuard *)0x0;
      bVar9 = NativeEntryPointData::TryGetSharedPropertyGuard(this_04,iVar11,&local_488);
      if (bVar9) {
        bVar28 = (local_488->value & 0xfffffffffffffffdU) != 0;
      }
      else {
        bVar28 = false;
      }
      iVar19 = 1;
      while (this_03 = pCVar26[(long)(iVar19 + -1) + 1], this_03 != (CtorCacheGuardTransferEntry)0x0
            ) {
        if (bVar9) {
          if (bVar28) {
            ThreadContext::RegisterConstructorCache
                      ((ThreadContext *)sharedPropertyGuard,iVar11,(ConstructorCache *)this_03);
          }
          else {
            ConstructorCache::InvalidateAsGuard((ConstructorCache *)this_03);
          }
        }
        iVar19 = iVar19 + 1;
      }
    }
  }
  iVar11 = (*(this->super_ProxyEntryPointInfo).super_ExpirableObject.super_FinalizableObject.
             super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0xb])(this);
  sourceContextId =
       *(uint *)**(undefined8 **)(*(long *)(CONCAT44(extraout_var,iVar11) + 0x20) + 0x70);
  iVar11 = (*(this->super_ProxyEntryPointInfo).super_ExpirableObject.super_FinalizableObject.
             super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0xb])(this);
  LVar12 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)CONCAT44(extraout_var_00,iVar11));
  bVar9 = Phases::IsEnabled((Phases *)&DAT_01447bf0,FailNativeCodeInstallPhase,sourceContextId,
                            LVar12);
  if (!bVar9) {
    return;
  }
  Throw::OutOfMemory();
LAB_006d77e8:
  bVar9 = lVar23 == 0;
  lVar23 = lVar23 + -1;
  if (bVar9) goto LAB_006d77ee;
  if (pEVar20->types[0] != (Type *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *local_50 = 1;
    bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x2115,"((*cache).types[__i] == nullptr)",
                                "(*cache).types[__i] == nullptr");
    if (!bVar9) goto LAB_006d7ca1;
    *local_50 = 0;
  }
  pEVar20 = (EquivalentTypeCache *)(pEVar20->types + 1);
  goto LAB_006d77e8;
}

Assistant:

void EntryPointInfo::InstallGuards(ScriptContext* scriptContext)
    {
        NativeEntryPointData * nativeEntryPointData = this->GetNativeEntryPointData();
        JitTransferData * jitTransferData = this->GetNativeEntryPointData()->GetJitTransferData();
        Assert(jitTransferData != nullptr && jitTransferData->GetIsReady());

        for (int i = 0; i < jitTransferData->lazyBailoutPropertyCount; i++)
        {
            Assert(jitTransferData->lazyBailoutProperties != nullptr);

            Js::PropertyId propertyId = jitTransferData->lazyBailoutProperties[i];
            Js::PropertyGuard* sharedPropertyGuard = nullptr;
            bool hasSharedPropertyGuard = nativeEntryPointData->TryGetSharedPropertyGuard(propertyId, sharedPropertyGuard);
            Assert(hasSharedPropertyGuard);
            bool isValid = hasSharedPropertyGuard && sharedPropertyGuard->IsValid();
            if (isValid)
            {
                scriptContext->GetThreadContext()->RegisterLazyBailout(propertyId, this);
            }
            else
            {
                OUTPUT_TRACE2(Js::LazyBailoutPhase, this->GetFunctionBody(), _u("Lazy bailout - Invalidation due to property: %s \n"), scriptContext->GetPropertyName(propertyId)->GetBuffer());
                this->Invalidate(true);
                return;
            }
        }


        // in-proc JIT
        if (jitTransferData->equivalentTypeGuardCount > 0)
        {
            Assert(jitTransferData->equivalentTypeGuardOffsets == nullptr);
            Assert(jitTransferData->equivalentTypeGuards != nullptr);

            int guardCount = jitTransferData->equivalentTypeGuardCount;
            JitEquivalentTypeGuard** guards = jitTransferData->equivalentTypeGuards;

            EquivalentTypeCache * cache = nativeEntryPointData->EnsureEquivalentTypeCache(guardCount, scriptContext, this);

            for (JitEquivalentTypeGuard** guard = guards; guard < guards + guardCount; guard++)
            {
                EquivalentTypeCache* oldCache = (*guard)->GetCache();
                // Copy the contents of the heap-allocated cache to the recycler-allocated version to make sure the types are
                // kept alive. Allow the properties pointer to refer to the heap-allocated arrays. It will stay alive as long
                // as the entry point is alive, and property entries contain no pointers to other recycler allocated objects.
                (*cache) = (*oldCache);
                // Set the recycler-allocated cache on the (heap-allocated) guard.
                (*guard)->SetCache(cache);

                for (uint i = 0; i < EQUIVALENT_TYPE_CACHE_SIZE; i++)
                {
                    if((*cache).types[i] != nullptr)
                    {
                        (*cache).types[i]->SetHasBeenCached();
                    }
                    else
                    {
#ifdef DEBUG
                        for (uint __i = i; __i < EQUIVALENT_TYPE_CACHE_SIZE; __i++)
                        { Assert((*cache).types[__i] == nullptr); }
#endif
                        break; // type array must be shrinked.
                    }
                }
                cache++;
            }
        }

#if ENABLE_OOP_NATIVE_CODEGEN
        if (jitTransferData->equivalentTypeGuardOffsets)
        {
            // InstallGuards
            int guardCount = jitTransferData->equivalentTypeGuardOffsets->count;
            EquivalentTypeCache* cache = this->nativeEntryPointData->EnsureEquivalentTypeCache(guardCount, scriptContext, this);
            char * nativeDataBuffer = this->GetOOPNativeEntryPointData()->GetNativeDataBuffer();
            for (int i = 0; i < guardCount; i++)
            {
                auto& cacheIDL = jitTransferData->equivalentTypeGuardOffsets->guards[i].cache;
                auto guardOffset = jitTransferData->equivalentTypeGuardOffsets->guards[i].offset;
                JitEquivalentTypeGuard* guard = (JitEquivalentTypeGuard*)(nativeDataBuffer + guardOffset);
                cache[i].guard = guard;
                cache[i].hasFixedValue = cacheIDL.hasFixedValue != 0;
                cache[i].isLoadedFromProto = cacheIDL.isLoadedFromProto != 0;
                cache[i].nextEvictionVictim = cacheIDL.nextEvictionVictim;
                cache[i].record.propertyCount = cacheIDL.record.propertyCount;
                cache[i].record.properties = (EquivalentPropertyEntry*)(nativeDataBuffer + cacheIDL.record.propertyOffset);
                for (int j = 0; j < EQUIVALENT_TYPE_CACHE_SIZE; j++)
                {
                    cache[i].types[j] = (Js::Type*)cacheIDL.types[j];
                }
                guard->SetCache(&cache[i]);
            }
        }

        // OOP JIT
        if (jitTransferData->typeGuardTransferData.entries != nullptr)
        {
            int propertyGuardCount = jitTransferData->typeGuardTransferData.propertyGuardCount;
            Field(FakePropertyGuardWeakReference*) * propertyGuardWeakRefs = this->nativeEntryPointData->EnsurePropertyGuardWeakRefs(propertyGuardCount, scriptContext->GetRecycler());
            ThreadContext* threadContext = scriptContext->GetThreadContext();
            auto next = &jitTransferData->typeGuardTransferData.entries;
            while (*next)
            {
                Js::PropertyId propertyId = (*next)->propId;
                Js::PropertyGuard* sharedPropertyGuard = nullptr;

                // We use the shared guard created during work item creation to ensure that the condition we assumed didn't change while
                // we were JIT-ing. If we don't have a shared property guard for this property then we must not need to protect it,
                // because it exists on the instance.  Unfortunately, this means that if we have a bug and fail to create a shared
                // guard for some property during work item creation, we won't find out about it here.
                bool isNeeded = nativeEntryPointData->TryGetSharedPropertyGuard(propertyId, sharedPropertyGuard);
                bool isValid = isNeeded ? sharedPropertyGuard->IsValid() : false;
                if (isNeeded)
                {
                    char * nativeDataBuffer = this->GetOOPNativeEntryPointData()->GetNativeDataBuffer();
                    for (unsigned int i = 0; i < (*next)->guardsCount; i++)
                    {
                        Js::JitIndexedPropertyGuard* guard = (Js::JitIndexedPropertyGuard*)(nativeDataBuffer + (*next)->guardOffsets[i]);
                        int guardIndex = guard->GetIndex();
                        Assert(guardIndex >= 0 && guardIndex < propertyGuardCount);
                        // We use the shared guard here to make sure the conditions we assumed didn't change while we were JIT-ing.
                        // If they did, we proactively invalidate the guard here, so that we bail out if we try to call this code.
                        if (isValid)
                        {
                            auto propertyGuardWeakRef = propertyGuardWeakRefs[guardIndex];
                            if (propertyGuardWeakRef == nullptr)
                            {
                                propertyGuardWeakRef = Js::FakePropertyGuardWeakReference::New(scriptContext->GetRecycler(), guard);
                                propertyGuardWeakRefs[guardIndex] = propertyGuardWeakRef;
                            }
                            Assert(propertyGuardWeakRef->Get() == guard);
                            threadContext->RegisterUniquePropertyGuard(propertyId, propertyGuardWeakRef);
                        }
                        else
                        {
                            guard->Invalidate();
                        }
                    }
                }
                *next = (*next)->next;
            }
        }
#endif

        // in-proc JIT
        // The propertyGuardsByPropertyId structure is temporary and serves only to register the type guards for the correct
        // properties.  If we've done code gen for this EntryPointInfo, typePropertyGuardsByPropertyId will have been used and nulled out.
        if (jitTransferData->propertyGuardsByPropertyId != nullptr)
        {
            int propertyGuardCount = jitTransferData->propertyGuardCount;
            Field(FakePropertyGuardWeakReference*) * propertyGuardWeakRefs = nativeEntryPointData->EnsurePropertyGuardWeakRefs(propertyGuardCount, scriptContext->GetRecycler());

            ThreadContext* threadContext = scriptContext->GetThreadContext();

            Js::TypeGuardTransferEntry* entry = jitTransferData->propertyGuardsByPropertyId;
            while (entry->propertyId != Js::Constants::NoProperty)
            {
                Js::PropertyId propertyId = entry->propertyId;
                Js::PropertyGuard* sharedPropertyGuard = nullptr;

                // We use the shared guard created during work item creation to ensure that the condition we assumed didn't change while
                // we were JIT-ing. If we don't have a shared property guard for this property then we must not need to protect it,
                // because it exists on the instance.  Unfortunately, this means that if we have a bug and fail to create a shared
                // guard for some property during work item creation, we won't find out about it here.
                bool isNeeded = nativeEntryPointData->TryGetSharedPropertyGuard(propertyId, sharedPropertyGuard);
                bool isValid = isNeeded ? sharedPropertyGuard->IsValid() : false;
                int entryGuardIndex = 0;
                while (entry->guards[entryGuardIndex] != nullptr)
                {
                    if (isNeeded)
                    {
                        Js::JitIndexedPropertyGuard* guard = entry->guards[entryGuardIndex];
                        int guardIndex = guard->GetIndex();
                        Assert(guardIndex >= 0 && guardIndex < propertyGuardCount);
                        // We use the shared guard here to make sure the conditions we assumed didn't change while we were JIT-ing.
                        // If they did, we proactively invalidate the guard here, so that we bail out if we try to call this code.
                        if (isValid)
                        {
                            auto propertyGuardWeakRef = propertyGuardWeakRefs[guardIndex];
                            if (propertyGuardWeakRef == nullptr)
                            {
                                propertyGuardWeakRef = Js::FakePropertyGuardWeakReference::New(scriptContext->GetRecycler(), guard);
                                propertyGuardWeakRefs[guardIndex] = propertyGuardWeakRef;
                            }
                            Assert(propertyGuardWeakRef->Get() == guard);
                            threadContext->RegisterUniquePropertyGuard(propertyId, propertyGuardWeakRef);
                        }
                        else
                        {
                            guard->Invalidate();
                        }
                    }
                    entryGuardIndex++;
                }
                entry = reinterpret_cast<Js::TypeGuardTransferEntry*>(&entry->guards[++entryGuardIndex]);
            }
        }


        // The ctorCacheGuardsByPropertyId structure is temporary and serves only to register the constructor cache guards for the correct
        // properties.  If we've done code gen for this EntryPointInfo, ctorCacheGuardsByPropertyId will have been used and nulled out.
        // Unlike type property guards, constructor cache guards use the live constructor caches associated with function objects. These are
        // recycler allocated and are kept alive by the constructorCaches field, where they were inserted during work item creation.

        // OOP JIT
        if (jitTransferData->ctorCacheTransferData.entries != nullptr)
        {
            ThreadContext* threadContext = scriptContext->GetThreadContext();

            CtorCacheTransferEntryIDL ** entries = jitTransferData->ctorCacheTransferData.entries;
            for (uint i = 0; i < jitTransferData->ctorCacheTransferData.ctorCachesCount; ++i)
            {
                Js::PropertyId propertyId = entries[i]->propId;
                Js::PropertyGuard* sharedPropertyGuard = nullptr;

                // We use the shared guard created during work item creation to ensure that the condition we assumed didn't change while
                // we were JIT-ing. If we don't have a shared property guard for this property then we must not need to protect it,
                // because it exists on the instance.  Unfortunately, this means that if we have a bug and fail to create a shared
                // guard for some property during work item creation, we won't find out about it here.
                bool isNeeded = nativeEntryPointData->TryGetSharedPropertyGuard(propertyId, sharedPropertyGuard);
                bool isValid = isNeeded ? sharedPropertyGuard->IsValid() : false;

                if (isNeeded)
                {
                    for (uint j = 0; j < entries[i]->cacheCount; ++j)
                    {
                        Js::ConstructorCache* cache = (Js::ConstructorCache*)(entries[i]->caches[j]);
                        // We use the shared cache here to make sure the conditions we assumed didn't change while we were JIT-ing.
                        // If they did, we proactively invalidate the cache here, so that we bail out if we try to call this code.
                        if (isValid)
                        {
                            threadContext->RegisterConstructorCache(propertyId, cache);
                        }
                        else
                        {
                            cache->InvalidateAsGuard();
                        }
                    }
                }
            }
        }

        if (jitTransferData->ctorCacheGuardsByPropertyId != nullptr)
        {
            ThreadContext* threadContext = scriptContext->GetThreadContext();

            Js::CtorCacheGuardTransferEntry* entry = jitTransferData->ctorCacheGuardsByPropertyId;
            while (entry->propertyId != Js::Constants::NoProperty)
            {
                Js::PropertyId propertyId = entry->propertyId;
                Js::PropertyGuard* sharedPropertyGuard = nullptr;

                // We use the shared guard created during work item creation to ensure that the condition we assumed didn't change while
                // we were JIT-ing. If we don't have a shared property guard for this property then we must not need to protect it,
                // because it exists on the instance.  Unfortunately, this means that if we have a bug and fail to create a shared
                // guard for some property during work item creation, we won't find out about it here.
                bool isNeeded = nativeEntryPointData->TryGetSharedPropertyGuard(propertyId, sharedPropertyGuard);
                bool isValid = isNeeded ? sharedPropertyGuard->IsValid() : false;
                int entryCacheIndex = 0;
                while (entry->caches[entryCacheIndex] != 0)
                {
                    if (isNeeded)
                    {
                        Js::ConstructorCache* cache = (Js::ConstructorCache*)(entry->caches[entryCacheIndex]);
                        // We use the shared cache here to make sure the conditions we assumed didn't change while we were JIT-ing.
                        // If they did, we proactively invalidate the cache here, so that we bail out if we try to call this code.
                        if (isValid)
                        {
                            threadContext->RegisterConstructorCache(propertyId, cache);
                        }
                        else
                        {
                            cache->InvalidateAsGuard();
                        }
                    }
                    entryCacheIndex++;
                }
                entry = reinterpret_cast<Js::CtorCacheGuardTransferEntry*>(&entry->caches[++entryCacheIndex]);
            }
        }

        if (PHASE_ON(Js::FailNativeCodeInstallPhase, this->GetFunctionBody()))
        {
            Js::Throw::OutOfMemory();
        }
    }